

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void lys_node_free(lys_node *node,_func_void_lys_node_ptr_void_ptr *private_destructor,int shallow)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  lys_node *plVar2;
  void *pvVar3;
  lys_ext_instance *__ptr;
  lys_when *w;
  lys_module *value;
  char *pcVar4;
  lys_node *node_00;
  long lVar5;
  long lVar6;
  int i;
  ulong uVar7;
  ulong uVar8;
  
  if (node == (lys_node *)0x0) {
    return;
  }
  if (node->module == (lys_module *)0x0) {
    __assert_fail("node->module",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xad0,
                  "void lys_node_free(struct lys_node *, void (*)(const struct lys_node *, void *), int)"
                 );
  }
  ctx = node->module->ctx;
  if (ctx == (ly_ctx *)0x0) {
    __assert_fail("node->module->ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0xad1,
                  "void lys_node_free(struct lys_node *, void (*)(const struct lys_node *, void *), int)"
                 );
  }
  if (private_destructor != (_func_void_lys_node_ptr_void_ptr *)0x0 && node->priv != (void *)0x0) {
    (*private_destructor)(node,node->priv);
  }
  lydict_remove(ctx,node->name);
  if ((node->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
    lys_iffeature_free(ctx,node->iffeature,node->iffeature_size,shallow,private_destructor);
    lydict_remove(ctx,node->dsc);
    lydict_remove(ctx,node->ref);
  }
  if ((shallow == 0) && ((node->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
    node_00 = node->child;
    while (node_00 != (lys_node *)0x0) {
      plVar2 = node_00->next;
      lys_node_free(node_00,private_destructor,0);
      node_00 = plVar2;
    }
  }
  lys_extension_instances_free(ctx,node->ext,(uint)node->ext_size,private_destructor);
  LVar1 = node->nodetype;
  switch(LVar1) {
  case LYS_CONTAINER:
    lydict_remove(ctx,*(char **)&node[1].flags);
    lVar5 = 0;
    for (uVar7 = 0; uVar7 < *(ushort *)(node->padding + 2); uVar7 = uVar7 + 1) {
      lys_tpdf_free(ctx,(lys_tpdf *)(node[1].ref + lVar5),private_destructor);
      lVar5 = lVar5 + 0x80;
    }
    free(node[1].ref);
    lVar5 = 0;
    for (uVar7 = 0; pcVar4 = node[1].dsc, uVar7 < node->padding[1]; uVar7 = uVar7 + 1) {
      lys_restr_free(ctx,(lys_restr *)(pcVar4 + lVar5),private_destructor);
      lVar5 = lVar5 + 0x38;
    }
LAB_0015772f:
    free(pcVar4);
    w = (lys_when *)node[1].name;
    goto LAB_00157926;
  case LYS_CHOICE:
switchD_00157538_caseD_2:
    w = *(lys_when **)node->hash;
LAB_00157926:
    lys_when_free(ctx,w,private_destructor);
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    break;
  case LYS_LEAF:
    ly_set_free((ly_set *)node->child);
    lVar5 = 0;
    for (uVar7 = 0; uVar7 < node->padding[3]; uVar7 = uVar7 + 1) {
      lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar5),private_destructor);
      lVar5 = lVar5 + 0x38;
    }
    free(node[1].dsc);
    lys_when_free(ctx,(lys_when *)node[1].name,private_destructor);
    lys_type_free(ctx,(lys_type *)&node[1].ref,private_destructor);
    lydict_remove(ctx,(char *)node[1].next);
    value = (lys_module *)node[1].prev;
    goto LAB_00157a16;
  case LYS_LEAFLIST:
    if (node->child != (lys_node *)0x0) {
      ly_set_free((ly_set *)node->child);
    }
    lVar5 = 0;
    for (uVar7 = 0; uVar7 < node->padding[3]; uVar7 = uVar7 + 1) {
      lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar5),private_destructor);
      lVar5 = lVar5 + 0x38;
    }
    free(node[1].dsc);
    for (uVar7 = 0; uVar7 < node->padding[2]; uVar7 = uVar7 + 1) {
      lydict_remove(ctx,*(char **)((node[1].prev)->padding + uVar7 * 8 + -0x1c));
    }
    free(node[1].prev);
    lys_when_free(ctx,(lys_when *)node[1].name,private_destructor);
    lys_type_free(ctx,(lys_type *)&node[1].ref,private_destructor);
    value = (lys_module *)node[1].next;
LAB_00157a16:
    lydict_remove(ctx,(char *)value);
    break;
  default:
    if (LVar1 == LYS_LIST) {
      lys_when_free(ctx,(lys_when *)node[1].name,private_destructor);
      lVar5 = 0;
      for (uVar7 = 0; uVar7 < node->padding[0]; uVar7 = uVar7 + 1) {
        lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar5),private_destructor);
        lVar5 = lVar5 + 0x38;
      }
      free(node[1].dsc);
      lVar5 = 0;
      for (uVar7 = 0; uVar7 < node->padding[1]; uVar7 = uVar7 + 1) {
        lys_tpdf_free(ctx,(lys_tpdf *)(node[1].ref + lVar5),private_destructor);
        lVar5 = lVar5 + 0x80;
      }
      free(node[1].ref);
      free(*(void **)&node[1].flags);
      for (uVar7 = 0; uVar7 < node->padding[3]; uVar7 = uVar7 + 1) {
        for (uVar8 = 0; __ptr = node[1].ext[uVar7 * 2],
            uVar8 < *(byte *)(node[1].ext + uVar7 * 2 + 1); uVar8 = uVar8 + 1) {
          lydict_remove(ctx,(char *)(&__ptr->def)[uVar8]);
        }
        free(__ptr);
      }
      free(node[1].ext);
      value = node[1].module;
      goto LAB_00157a16;
    }
    if (LVar1 == LYS_ANYXML) {
LAB_00157583:
      lVar5 = 0;
      for (uVar7 = 0; pcVar4 = node[1].dsc, uVar7 < node->padding[3]; uVar7 = uVar7 + 1) {
        lys_restr_free(ctx,(lys_restr *)(pcVar4 + lVar5),private_destructor);
        lVar5 = lVar5 + 0x38;
      }
      goto LAB_0015772f;
    }
    if (LVar1 == LYS_CASE) goto switchD_00157538_caseD_2;
    if (LVar1 != LYS_EXT) {
      if (LVar1 == LYS_RPC) {
LAB_00157614:
        lVar5 = 0;
        for (uVar7 = 0; pcVar4 = node[1].name, uVar7 < *(ushort *)(node->padding + 2);
            uVar7 = uVar7 + 1) {
          lys_tpdf_free(ctx,(lys_tpdf *)(pcVar4 + lVar5),private_destructor);
          lVar5 = lVar5 + 0x80;
        }
      }
      else if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
        lVar5 = 0;
        for (uVar7 = 0; uVar7 < *(ushort *)(node->padding + 2); uVar7 = uVar7 + 1) {
          lys_tpdf_free(ctx,(lys_tpdf *)((long)*(void **)node->hash + lVar5),private_destructor);
          lVar5 = lVar5 + 0x80;
        }
        free(*(void **)node->hash);
        lVar5 = 0;
        for (uVar7 = 0; pcVar4 = node[1].name, uVar7 < node->padding[1]; uVar7 = uVar7 + 1) {
          lys_restr_free(ctx,(lys_restr *)(pcVar4 + lVar5),private_destructor);
          lVar5 = lVar5 + 0x38;
        }
      }
      else if (LVar1 == LYS_GROUPING) {
        lVar5 = 0;
        for (uVar7 = 0; pcVar4 = *(char **)node->hash, uVar7 < *(ushort *)(node->padding + 2);
            uVar7 = uVar7 + 1) {
          lys_tpdf_free(ctx,(lys_tpdf *)(pcVar4 + lVar5),private_destructor);
          lVar5 = lVar5 + 0x80;
        }
      }
      else {
        if (LVar1 == LYS_USES) {
          for (uVar7 = 0; uVar7 < node->padding[2]; uVar7 = uVar7 + 1) {
            lVar6 = uVar7 * 0x50;
            lydict_remove(ctx,*(char **)(node[1].name + lVar6));
            lydict_remove(ctx,*(char **)(node[1].name + lVar6 + 8));
            lydict_remove(ctx,*(char **)(node[1].name + lVar6 + 0x10));
            lys_iffeature_free(ctx,*(lys_iffeature **)(node[1].name + lVar6 + 0x28),
                               node[1].name[lVar6 + 0x1b],0,private_destructor);
            lVar5 = 0;
            for (uVar8 = 0; pvVar3 = *(void **)(node[1].name + lVar6 + 0x38),
                uVar8 < (byte)node[1].name[lVar6 + 0x1e]; uVar8 = uVar8 + 1) {
              lys_restr_free(ctx,(lys_restr *)((long)pvVar3 + lVar5),private_destructor);
              lVar5 = lVar5 + 0x38;
            }
            free(pvVar3);
            for (uVar8 = 0; pvVar3 = *(void **)(node[1].name + lVar6 + 0x40),
                uVar8 < (byte)node[1].name[lVar6 + 0x1f]; uVar8 = uVar8 + 1) {
              lydict_remove(ctx,*(char **)((long)pvVar3 + uVar8 * 8));
            }
            free(pvVar3);
            lys_extension_instances_free
                      (ctx,*(lys_ext_instance ***)(node[1].name + lVar6 + 0x20),
                       (uint)(byte)node[1].name[lVar6 + 0x1a],private_destructor);
            if ((node[1].name[lVar6 + 0x1c] & 1U) != 0) {
              lydict_remove(ctx,*(char **)(node[1].name + lVar6 + 0x48));
            }
          }
          free(node[1].name);
          lVar5 = 0;
          for (uVar7 = 0; uVar7 < node->padding[3]; uVar7 = uVar7 + 1) {
            lys_augment_free(ctx,(lys_node_augment *)(node[1].dsc + lVar5),private_destructor);
            lVar5 = lVar5 + 0x68;
          }
          free(node[1].dsc);
          goto switchD_00157538_caseD_2;
        }
        if (LVar1 == LYS_ACTION) goto LAB_00157614;
        if (LVar1 == LYS_ANYDATA) goto LAB_00157583;
        if (LVar1 != LYS_NOTIF) break;
        lVar5 = 0;
        for (uVar7 = 0; uVar7 < node->padding[1]; uVar7 = uVar7 + 1) {
          lys_restr_free(ctx,(lys_restr *)(node[1].dsc + lVar5),private_destructor);
          lVar5 = lVar5 + 0x38;
        }
        free(node[1].dsc);
        lVar5 = 0;
        for (uVar7 = 0; pcVar4 = node[1].name, uVar7 < *(ushort *)(node->padding + 2);
            uVar7 = uVar7 + 1) {
          lys_tpdf_free(ctx,(lys_tpdf *)(pcVar4 + lVar5),private_destructor);
          lVar5 = lVar5 + 0x80;
        }
      }
      free(pcVar4);
      break;
    }
  case LYS_UNKNOWN:
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
           ,0xb18);
  }
  lys_node_unlink(node);
  free(node);
  return;
}

Assistant:

void
lys_node_free(struct lys_node *node, void (*private_destructor)(const struct lys_node *node, void *priv), int shallow)
{
    struct ly_ctx *ctx;
    struct lys_node *sub, *next;

    if (!node) {
        return;
    }

    assert(node->module);
    assert(node->module->ctx);

    ctx = node->module->ctx;

    /* remove private object */
    if (node->priv && private_destructor) {
        private_destructor(node, node->priv);
    }

    /* common part */
    lydict_remove(ctx, node->name);
    if (!(node->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
        lys_iffeature_free(ctx, node->iffeature, node->iffeature_size, shallow, private_destructor);
        lydict_remove(ctx, node->dsc);
        lydict_remove(ctx, node->ref);
    }

    if (!shallow && !(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LY_TREE_FOR_SAFE(node->child, next, sub) {
            lys_node_free(sub, private_destructor, 0);
        }
    }

    lys_extension_instances_free(ctx, node->ext, node->ext_size, private_destructor);

    /* specific part */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        lys_container_free(ctx, (struct lys_node_container *)node, private_destructor);
        break;
    case LYS_CHOICE:
        lys_when_free(ctx, ((struct lys_node_choice *)node)->when, private_destructor);
        break;
    case LYS_LEAF:
        lys_leaf_free(ctx, (struct lys_node_leaf *)node, private_destructor);
        break;
    case LYS_LEAFLIST:
        lys_leaflist_free(ctx, (struct lys_node_leaflist *)node, private_destructor);
        break;
    case LYS_LIST:
        lys_list_free(ctx, (struct lys_node_list *)node, private_destructor);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        lys_anydata_free(ctx, (struct lys_node_anydata *)node, private_destructor);
        break;
    case LYS_USES:
        lys_uses_free(ctx, (struct lys_node_uses *)node, private_destructor);
        break;
    case LYS_CASE:
        lys_when_free(ctx, ((struct lys_node_case *)node)->when, private_destructor);
        break;
    case LYS_AUGMENT:
        /* do nothing */
        break;
    case LYS_GROUPING:
        lys_grp_free(ctx, (struct lys_node_grp *)node, private_destructor);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        lys_rpc_action_free(ctx, (struct lys_node_rpc_action *)node, private_destructor);
        break;
    case LYS_NOTIF:
        lys_notif_free(ctx, (struct lys_node_notif *)node, private_destructor);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        lys_inout_free(ctx, (struct lys_node_inout *)node, private_destructor);
        break;
    case LYS_EXT:
    case LYS_UNKNOWN:
        LOGINT(ctx);
        break;
    }

    /* again common part */
    lys_node_unlink(node);
    free(node);
}